

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

int leveldb::VarintLength(uint64_t v)

{
  undefined4 local_14;
  uint64_t uStack_10;
  int len;
  uint64_t v_local;
  
  local_14 = 1;
  for (uStack_10 = v; 0x7f < uStack_10; uStack_10 = uStack_10 >> 7) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int VarintLength(uint64_t v) {
  int len = 1;
  while (v >= 128) {
    v >>= 7;
    len++;
  }
  return len;
}